

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_array.hpp
# Opt level: O0

void __thiscall
suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_int,_false>
::shift_buckets(suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_int,_false>
                *this,size_t dist,vector<unsigned_int,_std::allocator<unsigned_int>_> *param_2)

{
  value_type vVar1;
  size_t sVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  size_type sVar8;
  size_type sVar9;
  MPI_Datatype poVar10;
  ulong uVar11;
  reference pvVar12;
  MPI_Comm poVar13;
  ulong uVar14;
  long lVar15;
  ulong local_e0;
  size_t i;
  size_t local_split;
  uint uStack_c8;
  int p2_1;
  size_t last_gl_idx;
  size_t first_gl_idx;
  int p1_1;
  int recv_cnt_1;
  size_t p2_recv_cnt;
  int p2;
  int recv_cnt;
  size_t p1_recv_cnt;
  size_t p1_gl_end;
  uint uStack_78;
  int p1;
  size_t right_first_gl_idx;
  undefined1 local_68 [4];
  int n_irecvs;
  MPI_Request recv_reqs [2];
  MPI_Datatype mpi_index_t;
  datatype mxxindex_t;
  size_t prev_size;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_B2_local;
  size_t dist_local;
  suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_int,_false>
  *this_local;
  
  uVar3 = mxx::partition::block_decomposition_buffered<unsigned_int>::excl_prefix_size(&this->part);
  uVar7 = (ulong)uVar3;
  sVar9 = this->local_size;
  sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->local_B);
  if (sVar9 != sVar8) {
    __assert_fail("local_size == local_B.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                  ,0x264,
                  "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, unsigned int>::shift_buckets(std::size_t, std::vector<index_t> &) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned int, _CONSTRUCT_LCP = false]"
                 );
  }
  sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(param_2);
  if (sVar9 != this->local_size) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(param_2);
    mxxindex_t._20_4_ = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (param_2,this->local_size,(value_type_conflict3 *)&mxxindex_t.field_0x14);
  }
  mxx::get_datatype<unsigned_int>();
  poVar10 = mxx::datatype::type((datatype *)&mpi_index_t);
  right_first_gl_idx._4_4_ = 0;
  if (uVar7 + dist < this->n) {
    uStack_78 = (uint)(uVar7 + dist);
    iVar4 = mxx::partition::block_decomposition_buffered<unsigned_int>::target_processor
                      (&this->part,uStack_78);
    uVar5 = mxx::partition::block_decomposition_buffered<unsigned_int>::prefix_size
                      (&this->part,iVar4);
    uVar11 = (ulong)uVar5 - (uVar7 + dist);
    iVar6 = mxx::comm::rank(&this->comm);
    if (iVar4 != iVar6) {
      iVar6 = std::numeric_limits<int>::max();
      if ((ulong)(long)iVar6 <= uVar11) {
        __assert_fail("p1_recv_cnt < std::numeric_limits<int>::max()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                      ,0x27c,
                      "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, unsigned int>::shift_buckets(std::size_t, std::vector<index_t> &) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned int, _CONSTRUCT_LCP = false]"
                     );
      }
      pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](param_2,0);
      poVar13 = mxx::comm::operator_cast_to_ompi_communicator_t_(&this->comm);
      right_first_gl_idx._4_4_ = 1;
      MPI_Irecv(pvVar12,uVar11 & 0xffffffff,poVar10,iVar4,2,poVar13,local_68);
    }
    if ((uVar11 < this->local_size) && (iVar4 != this->p + -1)) {
      uVar14 = this->local_size - uVar11;
      iVar6 = std::numeric_limits<int>::max();
      if ((ulong)(long)iVar6 <= uVar14) {
        __assert_fail("p2_recv_cnt < std::numeric_limits<int>::max()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                      ,0x28a,
                      "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, unsigned int>::shift_buckets(std::size_t, std::vector<index_t> &) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned int, _CONSTRUCT_LCP = false]"
                     );
      }
      pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](param_2,0);
      poVar13 = mxx::comm::operator_cast_to_ompi_communicator_t_(&this->comm);
      lVar15 = (long)right_first_gl_idx._4_4_;
      right_first_gl_idx._4_4_ = right_first_gl_idx._4_4_ + 1;
      MPI_Irecv(pvVar12 + uVar11,uVar14 & 0xffffffff,poVar10,iVar4 + 1,2,poVar13,
                local_68 + lVar15 * 8);
    }
  }
  if (dist <= (uVar7 + this->local_size) - 1) {
    first_gl_idx._0_4_ = -1;
    if (dist <= uVar7) {
      last_gl_idx._0_4_ = uVar3 - (uint)dist;
      first_gl_idx._0_4_ =
           mxx::partition::block_decomposition_buffered<unsigned_int>::target_processor
                     (&this->part,(uint)last_gl_idx);
    }
    uStack_c8 = ~(uint)dist + uVar3 + (int)this->local_size;
    iVar4 = mxx::partition::block_decomposition_buffered<unsigned_int>::target_processor
                      (&this->part,uStack_c8);
    if ((int)first_gl_idx == iVar4) {
      i = 0;
    }
    else if ((int)first_gl_idx < 0) {
      i = dist - uVar7;
    }
    else {
      uVar3 = mxx::partition::block_decomposition_buffered<unsigned_int>::prefix_size
                        (&this->part,(int)first_gl_idx);
      i = (uVar3 + dist) - uVar7;
      iVar6 = mxx::comm::rank(&this->comm);
      if ((int)first_gl_idx == iVar6) {
        __assert_fail("p1 != comm.rank()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                      ,0x2a2,
                      "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, unsigned int>::shift_buckets(std::size_t, std::vector<index_t> &) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned int, _CONSTRUCT_LCP = false]"
                     );
      }
      pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (&this->local_B,0);
      poVar13 = mxx::comm::operator_cast_to_ompi_communicator_t_(&this->comm);
      MPI_Send(pvVar12,i & 0xffffffff,poVar10,(int)first_gl_idx,2,poVar13);
    }
    iVar6 = mxx::comm::rank(&this->comm);
    if (iVar4 == iVar6) {
      if (i != dist) {
        __assert_fail("local_split == dist",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                      ,0x2b3,
                      "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, unsigned int>::shift_buckets(std::size_t, std::vector<index_t> &) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned int, _CONSTRUCT_LCP = false]"
                     );
      }
      for (local_e0 = i; local_e0 < this->local_size; local_e0 = local_e0 + 1) {
        pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (&this->local_B,local_e0);
        vVar1 = *pvVar12;
        pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (param_2,local_e0 - i);
        *pvVar12 = vVar1;
      }
    }
    else {
      pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (&this->local_B,0);
      sVar2 = this->local_size;
      poVar13 = mxx::comm::operator_cast_to_ompi_communicator_t_(&this->comm);
      MPI_Send(pvVar12 + i,(int)sVar2 - (int)i,poVar10,iVar4,2,poVar13);
    }
  }
  MPI_Waitall(right_first_gl_idx._4_4_,local_68,0);
  mxx::datatype::~datatype((datatype *)&mpi_index_t);
  return;
}

Assistant:

void shift_buckets(std::size_t dist, std::vector<index_t>& local_B2) {
    // get # elements to the left
    std::size_t prev_size = part.excl_prefix_size();
    assert(local_size == local_B.size());

    // init B2
    if (local_B2.size() != local_size){
        local_B2.clear();
        local_B2.resize(local_size, 0);
    }

    mxx::datatype mxxindex_t = mxx::get_datatype<index_t>();
    MPI_Datatype mpi_index_t = mxxindex_t.type();

    MPI_Request recv_reqs[2];
    int n_irecvs = 0;
    // receive elements from the right
    if (prev_size + dist < n) {
        std::size_t right_first_gl_idx = prev_size + dist;
        int p1 = part.target_processor(right_first_gl_idx);

        std::size_t p1_gl_end = part.prefix_size(p1);
        std::size_t p1_recv_cnt = p1_gl_end - right_first_gl_idx;

        if (p1 != comm.rank()) {
            // only receive if the source is not myself (i.e., `rank`)
            // [otherwise results are directly written instead of MPI_Sended]
            assert(p1_recv_cnt < std::numeric_limits<int>::max());
            int recv_cnt = p1_recv_cnt;
            MPI_Irecv(&local_B2[0],recv_cnt, mpi_index_t, p1,
                      PSAC_TAG_SHIFT, comm, &recv_reqs[n_irecvs++]);
        }

        if (p1_recv_cnt < local_size && p1 != p-1) {
            // also receive from one more processor
            int p2 = p1+1;
            // since p2 has at least local_size - 1 elements and at least
            // one element came from p1, we can assume that the receive count
            // is our local size minus the already received elements
            std::size_t p2_recv_cnt = local_size - p1_recv_cnt;

            assert(p2_recv_cnt < std::numeric_limits<int>::max());
            int recv_cnt = p2_recv_cnt;
            // send to `p1` (which is necessarily different from `rank`)
            MPI_Irecv(&local_B2[0] + p1_recv_cnt, recv_cnt, mpi_index_t, p2,
                      PSAC_TAG_SHIFT, comm, &recv_reqs[n_irecvs++]);
        }
    }

    // send elements to the left (split to at most 2 target processors)
    if (prev_size + local_size - 1 >= dist) {
        int p1 = -1;
        if (prev_size >= dist) {
            std::size_t first_gl_idx = prev_size - dist;
            p1 = part.target_processor(first_gl_idx);
        }
        std::size_t last_gl_idx = prev_size + local_size - 1 - dist;
        int p2 = part.target_processor(last_gl_idx);

        std::size_t local_split;
        if (p1 != p2) {
            // local start index of area for second processor
            if (p1 >= 0) {
                local_split = part.prefix_size(p1) + dist - prev_size;
                // send to first processor
                assert(p1 != comm.rank());
                MPI_Send(&local_B[0], local_split,
                         mpi_index_t, p1, PSAC_TAG_SHIFT, comm);
            } else {
                // p1 doesn't exist, then there is no prefix to add
                local_split = dist - prev_size;
            }
        } else {
            // only one target processor
            local_split = 0;
        }

        if (p2 != comm.rank()) {
            MPI_Send(&local_B[0] + local_split, local_size - local_split,
                     mpi_index_t, p2, PSAC_TAG_SHIFT, comm);
        } else {
            // in this case the split should be exactly at `dist`
            assert(local_split == dist);
            // locally reassign
            for (std::size_t i = local_split; i < local_size; ++i) {
                local_B2[i-local_split] = local_B[i];
            }
        }
    }

    // wait for successful receive:
    MPI_Waitall(n_irecvs, recv_reqs, MPI_STATUS_IGNORE);
}